

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcSymProp * __thiscall CTcParser::look_up_prop(CTcParser *this,CTcToken *tok,int show_err)

{
  tctarg_prop_id_t tVar1;
  tc_symtype_t tVar2;
  size_t sVar3;
  char *pcVar4;
  int in_EDX;
  CTcToken *in_RSI;
  long in_RDI;
  CTcSymProp *prop;
  undefined2 in_stack_ffffffffffffff88;
  tctarg_prop_id_t in_stack_ffffffffffffff8a;
  int in_stack_ffffffffffffff8c;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  CTcSymProp *local_20;
  
  CTcToken::get_text(in_RSI);
  CTcToken::get_text_len(in_RSI);
  local_20 = (CTcSymProp *)
             CTcPrsSymtab::find((CTcPrsSymtab *)
                                CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),
                                (textchar_t *)
                                CONCAT44(in_stack_ffffffffffffff8c,
                                         CONCAT22(in_stack_ffffffffffffff8a,
                                                  in_stack_ffffffffffffff88)),0x2c1c53);
  if (local_20 == (CTcSymProp *)0x0) {
    local_20 = (CTcSymProp *)CTcSymbolBase::operator_new(0x2c1cb9);
    CTcToken::get_text(in_RSI);
    pcVar4 = (char *)CTcToken::get_text_len(in_RSI);
    tVar1 = CTcGenTarg::new_prop_id(G_cg);
    CTcSymProp::CTcSymProp
              (local_20,pcVar4,CONCAT26(tVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff8a);
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),local_20);
    (*((CVmHashEntry *)&(local_20->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->
      _vptr_CVmHashEntry[0xf])();
  }
  else {
    tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_20);
    if (tVar2 != TC_SYM_PROP) {
      if (in_EDX != 0) {
        sVar3 = CTcToken::get_text_len(in_RSI);
        pcVar4 = CTcToken::get_text(in_RSI);
        CTcTokenizer::log_error(0x2b63,sVar3 & 0xffffffff,pcVar4);
      }
      local_20 = (CTcSymProp *)0x0;
    }
  }
  return local_20;
}

Assistant:

CTcSymProp *CTcParser::look_up_prop(const CTcToken *tok, int show_err)
{
    /* look up the symbol */
    CTcSymProp *prop = (CTcSymProp *)global_symtab_->find(
        tok->get_text(), tok->get_text_len());

    /* if it's already defined, make sure it's a property */
    if (prop != 0)
    {
        /* make sure it's a property */
        if (prop->get_type() != TC_SYM_PROP)
        {
            /* log an error if appropriate */
            if (show_err)
                G_tok->log_error(TCERR_REDEF_AS_PROP,
                                 (int)tok->get_text_len(), tok->get_text());

            /* we can't use the symbol, so forget it */
            prop = 0;
        }
    }
    else
    {
        /* create the new property symbol */
        prop = new CTcSymProp(tok->get_text(), tok->get_text_len(),
                              FALSE, G_cg->new_prop_id());

        /* add it to the global symbol table */
        global_symtab_->add_entry(prop);

        /* mark it as referenced */
        prop->mark_referenced();
    }

    /* return the property symbol */
    return prop;
}